

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

void ODDLParser::DDLNode::releaseNodes(void)

{
  DDLNode *this;
  bool bVar1;
  size_type sVar2;
  reference ppDVar3;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  local_18;
  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
  local_10;
  DDLNodeIt it;
  
  sVar2 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::size
                    ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
                     s_allocatedNodes);
  if (sVar2 != 0) {
    local_10._M_current =
         (DDLNode **)
         std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::begin
                   ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
                    s_allocatedNodes);
    while( true ) {
      local_18._M_current =
           (DDLNode **)
           std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::end
                     ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
                      s_allocatedNodes);
      bVar1 = __gnu_cxx::operator!=(&local_10,&local_18);
      if (!bVar1) break;
      ppDVar3 = __gnu_cxx::
                __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                ::operator*(&local_10);
      if (*ppDVar3 != (DDLNode *)0x0) {
        ppDVar3 = __gnu_cxx::
                  __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
                  ::operator*(&local_10);
        this = *ppDVar3;
        if (this != (DDLNode *)0x0) {
          ~DDLNode(this);
          operator_delete(this,0x88);
        }
      }
      __gnu_cxx::
      __normal_iterator<ODDLParser::DDLNode_**,_std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>_>
      ::operator++(&local_10,0);
    }
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::clear
              ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
               s_allocatedNodes);
  }
  return;
}

Assistant:

void DDLNode::releaseNodes() {
    if( s_allocatedNodes.size() > 0 ) {
        for( DDLNodeIt it = s_allocatedNodes.begin(); it != s_allocatedNodes.end(); it++ ) {
            if( *it ) {
                delete *it;
            }
        }
        s_allocatedNodes.clear();
    }
}